

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O0

void __thiscall draco::PointAttribute::PointAttribute(PointAttribute *this,GeometryAttribute *att)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
  *this_00;
  
  uVar1 = *in_RSI;
  uVar2 = in_RSI[1];
  uVar3 = in_RSI[2];
  uVar4 = in_RSI[3];
  uVar5 = in_RSI[4];
  uVar6 = in_RSI[5];
  uVar7 = in_RSI[7];
  in_RDI[6] = in_RSI[6];
  in_RDI[7] = uVar7;
  in_RDI[4] = uVar5;
  in_RDI[5] = uVar6;
  in_RDI[2] = uVar3;
  in_RDI[3] = uVar4;
  *in_RDI = uVar1;
  in_RDI[1] = uVar2;
  this_00 = (unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
             *)(in_RDI + 8);
  std::unique_ptr<draco::DataBuffer,std::default_delete<draco::DataBuffer>>::
  unique_ptr<std::default_delete<draco::DataBuffer>,void>
            ((unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)this_00);
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  ::IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                     *)0x1cbf67);
  *(undefined4 *)(in_RDI + 0xc) = 0;
  *(undefined1 *)((long)in_RDI + 100) = 0;
  std::unique_ptr<draco::AttributeTransformData,std::default_delete<draco::AttributeTransformData>>
  ::unique_ptr<std::default_delete<draco::AttributeTransformData>,void>(this_00);
  return;
}

Assistant:

PointAttribute::PointAttribute(const GeometryAttribute &att)
    : GeometryAttribute(att),
      num_unique_entries_(0),
      identity_mapping_(false) {}